

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O3

string * __thiscall
spirv_cross::CompilerMSL::compile_abi_cxx11_(string *__return_storage_ptr__,CompilerMSL *this)

{
  BackendVariations *pBVar1;
  StringStream<4096UL,_4096UL> *this_00;
  undefined1 uVar2;
  bool bVar3;
  ExecutionModel EVar4;
  uint32_t uVar5;
  SPIREntryPoint *pSVar6;
  SPIRFunction *func;
  CompilerError *this_01;
  undefined1 uVar7;
  char (*ts_1) [28];
  string discard_expr;
  string builtin_helper_invocation;
  char (*in_stack_ffffffffffffff08) [12];
  string local_e8;
  Bitset local_c8;
  string local_88;
  _Hashtable<spirv_cross::TypedID<(spirv_cross::Types)2>,_spirv_cross::TypedID<(spirv_cross::Types)2>,_std::allocator<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::__detail::_Identity,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_68;
  
  replace_illegal_entry_point_names(this);
  ParsedIR::fixup_reserved_names(&(this->super_CompilerGLSL).super_Compiler.ir);
  (this->super_CompilerGLSL).options.vulkan_semantics = true;
  (this->super_CompilerGLSL).options.es = false;
  (this->super_CompilerGLSL).options.version = 0x1c2;
  ::std::__cxx11::string::_M_replace
            ((ulong)&(this->super_CompilerGLSL).backend.null_pointer_literal,0,
             (char *)(this->super_CompilerGLSL).backend.null_pointer_literal._M_string_length,
             0x2c54a6);
  (this->super_CompilerGLSL).backend.float_literal_suffix = false;
  (this->super_CompilerGLSL).backend.uint32_t_literal_suffix = true;
  (this->super_CompilerGLSL).backend.int16_t_literal_suffix = "";
  (this->super_CompilerGLSL).backend.uint16_t_literal_suffix = "";
  (this->super_CompilerGLSL).backend.basic_int_type = "int";
  (this->super_CompilerGLSL).backend.basic_uint_type = "uint";
  (this->super_CompilerGLSL).backend.basic_int8_type = "char";
  (this->super_CompilerGLSL).backend.basic_uint8_type = "uchar";
  (this->super_CompilerGLSL).backend.basic_int16_type = "short";
  (this->super_CompilerGLSL).backend.basic_uint16_type = "ushort";
  (this->super_CompilerGLSL).backend.boolean_mix_function = "select";
  (this->super_CompilerGLSL).backend.swizzle_is_function = false;
  (this->super_CompilerGLSL).backend.shared_is_implied = false;
  (this->super_CompilerGLSL).backend.use_initializer_list = true;
  (this->super_CompilerGLSL).backend.use_typed_initializer_list = true;
  (this->super_CompilerGLSL).backend.unsized_array_supported = false;
  (this->super_CompilerGLSL).backend.can_declare_arrays_inline = false;
  (this->super_CompilerGLSL).backend.native_row_major_matrix = false;
  (this->super_CompilerGLSL).backend.allow_truncated_access_chain = true;
  (this->super_CompilerGLSL).backend.comparison_image_samples_scalar = true;
  (this->super_CompilerGLSL).backend.native_pointers = true;
  (this->super_CompilerGLSL).backend.nonuniform_qualifier = "";
  (this->super_CompilerGLSL).backend.support_small_type_sampling_result = true;
  (this->super_CompilerGLSL).backend.force_gl_in_out_block = false;
  (this->super_CompilerGLSL).backend.force_merged_mesh_block = false;
  (this->super_CompilerGLSL).backend.supports_empty_struct = true;
  (this->super_CompilerGLSL).backend.support_64bit_switch = true;
  (this->super_CompilerGLSL).backend.boolean_in_struct_remapped_type = Short;
  bVar3 = (bool)((this->msl_options).force_native_arrays ^ 1);
  (this->super_CompilerGLSL).backend.can_return_array = bVar3;
  (this->super_CompilerGLSL).backend.array_is_value_type = bVar3;
  (this->super_CompilerGLSL).backend.array_is_value_type_in_buffer_blocks = false;
  (this->super_CompilerGLSL).backend.support_pointer_to_pointer = true;
  (this->super_CompilerGLSL).backend.implicit_c_integer_promotion_rules = true;
  uVar2 = (this->msl_options).capture_output_to_buffer;
  this->capture_output_to_buffer = (bool)uVar2;
  uVar7 = true;
  if ((this->msl_options).disable_rasterization == false) {
    uVar7 = uVar2;
  }
  this->is_rasterization_disabled = (bool)uVar7;
  EVar4 = Compiler::get_execution_model((Compiler *)this);
  if (EVar4 == ExecutionModelMeshEXT) {
    pSVar6 = Compiler::get_entry_point((Compiler *)this);
    if (((pSVar6->flags).lower & 0x8000000) == 0) {
      (this->msl_options).enable_point_size_builtin = false;
    }
  }
  this->next_metal_resource_ids[4] = 0;
  this->next_metal_resource_ids[5] = 0;
  this->next_metal_resource_ids[6] = 0;
  this->next_metal_resource_ids[7] = 0;
  this->next_metal_resource_ids[0] = 0;
  this->next_metal_resource_ids[1] = 0;
  this->next_metal_resource_ids[2] = 0;
  this->next_metal_resource_ids[3] = 0;
  CompilerGLSL::fixup_anonymous_struct_names(&this->super_CompilerGLSL);
  CompilerGLSL::fixup_type_alias(&this->super_CompilerGLSL);
  (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x3d])(this);
  EVar4 = Compiler::get_execution_model((Compiler *)this);
  if (EVar4 == ExecutionModelMeshEXT) {
    emit_mesh_entry_point(this);
  }
  pBVar1 = &(this->super_CompilerGLSL).backend;
  sync_entry_point_aliases_and_names(this);
  Compiler::build_function_control_flow_graphs_and_analyze((Compiler *)this);
  Compiler::update_active_builtins((Compiler *)this);
  Compiler::analyze_image_and_sampler_usage((Compiler *)this);
  analyze_sampled_image_usage(this);
  Compiler::analyze_interlocked_resource_usage((Compiler *)this);
  analyze_workgroup_variables(this);
  preprocess_op_codes(this);
  build_implicit_builtins(this);
  if ((((this->msl_options).manual_helper_invocation_updates == true) &&
      (0x4f4b < (this->msl_options).msl_version)) && (this->needs_helper_invocation == true)) {
    ts_1 = (char (*) [28])0x1;
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x14])(&local_c8,this,0x17);
    join<std::__cxx11::string&,char_const(&)[28]>
              (&local_e8,(spirv_cross *)&local_c8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               " = true, discard_fragment()",ts_1);
    if ((this->msl_options).force_fragment_with_side_effects_execution == true) {
      join<char_const(&)[2],std::__cxx11::string&,char_const(&)[5],std::__cxx11::string&,char_const(&)[12]>
                (&local_88,(spirv_cross *)0x2d0035,(char (*) [2])&local_c8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)" ? (",
                 (char (*) [5])&local_e8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)") : (void)0",
                 in_stack_ffffffffffffff08);
      ::std::__cxx11::string::operator=((string *)&local_e8,(string *)&local_88);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p);
      }
    }
    ::std::__cxx11::string::_M_assign((string *)pBVar1);
    ::std::__cxx11::string::_M_assign((string *)&(this->super_CompilerGLSL).backend.demote_literal);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
      operator_delete(local_e8._M_dataplus._M_p);
    }
    if ((size_type *)local_c8.lower != &local_c8.higher._M_h._M_bucket_count) {
      operator_delete((void *)local_c8.lower);
    }
  }
  else {
    ::std::__cxx11::string::_M_replace
              ((ulong)pBVar1,0,
               (char *)(this->super_CompilerGLSL).backend.discard_literal._M_string_length,0x2c58da)
    ;
    ::std::__cxx11::string::_M_replace
              ((ulong)&(this->super_CompilerGLSL).backend.demote_literal,0,
               (char *)(this->super_CompilerGLSL).backend.demote_literal._M_string_length,0x2c58da);
  }
  CompilerGLSL::fixup_image_load_store_access(&this->super_CompilerGLSL);
  Compiler::get_active_interface_variables
            ((unordered_set<spirv_cross::TypedID<(spirv_cross::Types)2>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::allocator<spirv_cross::TypedID<(spirv_cross::Types)2>_>_>
              *)&local_68,(Compiler *)this);
  Compiler::set_enabled_interface_variables
            ((Compiler *)this,
             (unordered_set<spirv_cross::TypedID<(spirv_cross::Types)2>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::allocator<spirv_cross::TypedID<(spirv_cross::Types)2>_>_>
              *)&local_68);
  ::std::
  _Hashtable<spirv_cross::TypedID<(spirv_cross::Types)2>,_spirv_cross::TypedID<(spirv_cross::Types)2>,_std::allocator<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::__detail::_Identity,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&local_68);
  if ((this->msl_options).force_active_argument_buffer_resources == true) {
    activate_argument_buffer_resources(this);
  }
  if (this->swizzle_buffer_id != 0) {
    Compiler::add_active_interface_variable((Compiler *)this,this->swizzle_buffer_id);
  }
  if (this->buffer_size_buffer_id != 0) {
    Compiler::add_active_interface_variable((Compiler *)this,this->buffer_size_buffer_id);
  }
  if (this->view_mask_buffer_id != 0) {
    Compiler::add_active_interface_variable((Compiler *)this,this->view_mask_buffer_id);
  }
  if (this->dynamic_offsets_buffer_id != 0) {
    Compiler::add_active_interface_variable((Compiler *)this,this->dynamic_offsets_buffer_id);
  }
  if (this->builtin_layer_id != 0) {
    Compiler::add_active_interface_variable((Compiler *)this,this->builtin_layer_id);
  }
  if ((this->builtin_dispatch_base_id != 0) && ((this->msl_options).msl_version < 0x27d8)) {
    Compiler::add_active_interface_variable((Compiler *)this,this->builtin_dispatch_base_id);
  }
  if (this->builtin_sample_mask_id != 0) {
    Compiler::add_active_interface_variable((Compiler *)this,this->builtin_sample_mask_id);
  }
  if (this->builtin_frag_depth_id != 0) {
    Compiler::add_active_interface_variable((Compiler *)this,this->builtin_frag_depth_id);
  }
  ::std::__cxx11::string::_M_replace
            ((ulong)&this->qual_pos_var_name,0,(char *)(this->qual_pos_var_name)._M_string_length,
             0x2aec75);
  EVar4 = Compiler::get_execution_model((Compiler *)this);
  if (EVar4 == ExecutionModelMeshEXT) {
    EVar4 = Compiler::get_execution_model((Compiler *)this);
    CompilerGLSL::fixup_implicit_builtin_block_names(&this->super_CompilerGLSL,EVar4);
  }
  else {
    uVar5 = add_interface_block(this,StorageClassOutput,false);
    (this->stage_out_var_id).id = uVar5;
    uVar5 = add_interface_block(this,StorageClassOutput,true);
    (this->patch_stage_out_var_id).id = uVar5;
    uVar5 = add_interface_block(this,StorageClassInput,false);
    (this->stage_in_var_id).id = uVar5;
  }
  EVar4 = Compiler::get_execution_model((Compiler *)this);
  if (EVar4 == ExecutionModelTessellationEvaluation) {
    uVar5 = add_interface_block(this,StorageClassInput,true);
    (this->patch_stage_in_var_id).id = uVar5;
  }
  EVar4 = Compiler::get_execution_model((Compiler *)this);
  if (EVar4 == ExecutionModelTessellationControl) {
    uVar5 = add_interface_block_pointer(this,(this->stage_out_var_id).id,StorageClassOutput);
    (this->stage_out_ptr_var_id).id = uVar5;
  }
  bVar3 = Compiler::is_tessellation_shader((Compiler *)this);
  if (bVar3) {
    uVar5 = add_interface_block_pointer(this,(this->stage_in_var_id).id,StorageClassInput);
    (this->stage_in_ptr_var_id).id = uVar5;
  }
  EVar4 = Compiler::get_execution_model((Compiler *)this);
  if (EVar4 == ExecutionModelMeshEXT) {
    uVar5 = add_meshlet_block(this,false);
    (this->mesh_out_per_vertex).id = uVar5;
    uVar5 = add_meshlet_block(this,true);
    (this->mesh_out_per_primitive).id = uVar5;
  }
  if ((this->stage_out_var_id).id == 0) {
    this->is_rasterization_disabled = true;
  }
  localize_global_variables(this);
  extract_global_variables_from_functions(this);
  mark_packable_structs(this);
  CompilerGLSL::reorder_type_alias(&this->super_CompilerGLSL);
  fix_up_shader_inputs_outputs(this);
  if ((this->msl_options).argument_buffers == true) {
    if ((this->msl_options).msl_version < 20000) {
      this_01 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(this_01,"Argument buffers can only be used with MSL 2.0 and up.")
      ;
      __cxa_throw(this_01,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    analyze_argument_buffers(this);
  }
  this_00 = &(this->super_CompilerGLSL).buffer;
  uVar5 = 0;
  do {
    CompilerGLSL::reset(&this->super_CompilerGLSL,uVar5);
    this->next_metal_resource_ids[4] = 0;
    this->next_metal_resource_ids[5] = 0;
    this->next_metal_resource_ids[6] = 0;
    this->next_metal_resource_ids[7] = 0;
    this->next_metal_resource_ids[1] = 0;
    this->next_metal_resource_ids[2] = 0;
    this->next_metal_resource_ids[3] = 0;
    this->next_metal_resource_ids[4] = 0;
    this->next_metal_resource_index_buffer = 0;
    this->next_metal_resource_index_texture = 0;
    this->next_metal_resource_index_sampler = 0;
    this->next_metal_resource_ids[0] = 0;
    StringStream<4096UL,_4096UL>::reset(this_00);
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0xe])(this);
    emit_custom_templates(this);
    emit_custom_functions(this);
    emit_specialization_constants_and_structs(this);
    emit_resources(this);
    func = Variant::get<spirv_cross::SPIRFunction>
                     ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                      super_VectorView<spirv_cross::Variant>.ptr +
                      (this->super_CompilerGLSL).super_Compiler.ir.default_entry_point.id);
    local_c8.lower = 0;
    local_c8.higher._M_h._M_buckets = &local_c8.higher._M_h._M_single_bucket;
    local_c8.higher._M_h._M_bucket_count = 1;
    local_c8.higher._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_c8.higher._M_h._M_element_count = 0;
    local_c8.higher._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    local_c8.higher._M_h._M_rehash_policy._4_4_ = 0;
    local_c8.higher._M_h._M_rehash_policy._M_next_resize = 0;
    local_c8.higher._M_h._M_single_bucket = (__node_base_ptr)0x0;
    CompilerGLSL::emit_function(&this->super_CompilerGLSL,func,&local_c8);
    ::std::
    _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::~_Hashtable(&local_c8.higher._M_h);
    uVar5 = uVar5 + 1;
    bVar3 = Compiler::is_forcing_recompilation((Compiler *)this);
  } while (bVar3);
  StringStream<4096ul,4096ul>::str_abi_cxx11_(__return_storage_ptr__,this_00);
  return __return_storage_ptr__;
}

Assistant:

string CompilerMSL::compile()
{
	replace_illegal_entry_point_names();
	ir.fixup_reserved_names();

	// Do not deal with GLES-isms like precision, older extensions and such.
	options.vulkan_semantics = true;
	options.es = false;
	options.version = 450;
	backend.null_pointer_literal = "nullptr";
	backend.float_literal_suffix = false;
	backend.uint32_t_literal_suffix = true;
	backend.int16_t_literal_suffix = "";
	backend.uint16_t_literal_suffix = "";
	backend.basic_int_type = "int";
	backend.basic_uint_type = "uint";
	backend.basic_int8_type = "char";
	backend.basic_uint8_type = "uchar";
	backend.basic_int16_type = "short";
	backend.basic_uint16_type = "ushort";
	backend.boolean_mix_function = "select";
	backend.swizzle_is_function = false;
	backend.shared_is_implied = false;
	backend.use_initializer_list = true;
	backend.use_typed_initializer_list = true;
	backend.native_row_major_matrix = false;
	backend.unsized_array_supported = false;
	backend.can_declare_arrays_inline = false;
	backend.allow_truncated_access_chain = true;
	backend.comparison_image_samples_scalar = true;
	backend.native_pointers = true;
	backend.nonuniform_qualifier = "";
	backend.support_small_type_sampling_result = true;
	backend.force_merged_mesh_block = false;
	backend.force_gl_in_out_block = false;
	backend.supports_empty_struct = true;
	backend.support_64bit_switch = true;
	backend.boolean_in_struct_remapped_type = SPIRType::Short;

	// Allow Metal to use the array<T> template unless we force it off.
	backend.can_return_array = !msl_options.force_native_arrays;
	backend.array_is_value_type = !msl_options.force_native_arrays;
	// Arrays which are part of buffer objects are never considered to be value types (just plain C-style).
	backend.array_is_value_type_in_buffer_blocks = false;
	backend.support_pointer_to_pointer = true;
	backend.implicit_c_integer_promotion_rules = true;

	capture_output_to_buffer = msl_options.capture_output_to_buffer;
	is_rasterization_disabled = msl_options.disable_rasterization || capture_output_to_buffer;

	if (is_mesh_shader() && !get_entry_point().flags.get(ExecutionModeOutputPoints))
		msl_options.enable_point_size_builtin = false;

	// Initialize array here rather than constructor, MSVC 2013 workaround.
	for (auto &id : next_metal_resource_ids)
		id = 0;

	fixup_anonymous_struct_names();
	fixup_type_alias();
	replace_illegal_names();
	if (get_execution_model() == ExecutionModelMeshEXT)
	{
		// Emit proxy entry-point for the sake of copy-pass
		emit_mesh_entry_point();
	}
	sync_entry_point_aliases_and_names();

	build_function_control_flow_graphs_and_analyze();
	update_active_builtins();
	analyze_image_and_sampler_usage();
	analyze_sampled_image_usage();
	analyze_interlocked_resource_usage();
	analyze_workgroup_variables();
	preprocess_op_codes();
	build_implicit_builtins();

	if (needs_manual_helper_invocation_updates() && needs_helper_invocation)
	{
		string builtin_helper_invocation = builtin_to_glsl(BuiltInHelperInvocation, StorageClassInput);
		string discard_expr = join(builtin_helper_invocation, " = true, discard_fragment()");
		if (msl_options.force_fragment_with_side_effects_execution)
			discard_expr = join("!", builtin_helper_invocation, " ? (", discard_expr, ") : (void)0");
		backend.discard_literal = discard_expr;
		backend.demote_literal = discard_expr;
	}
	else
	{
		backend.discard_literal = "discard_fragment()";
		backend.demote_literal = "discard_fragment()";
	}

	fixup_image_load_store_access();

	set_enabled_interface_variables(get_active_interface_variables());
	if (msl_options.force_active_argument_buffer_resources)
		activate_argument_buffer_resources();

	if (swizzle_buffer_id)
		add_active_interface_variable(swizzle_buffer_id);
	if (buffer_size_buffer_id)
		add_active_interface_variable(buffer_size_buffer_id);
	if (view_mask_buffer_id)
		add_active_interface_variable(view_mask_buffer_id);
	if (dynamic_offsets_buffer_id)
		add_active_interface_variable(dynamic_offsets_buffer_id);
	if (builtin_layer_id)
		add_active_interface_variable(builtin_layer_id);
	if (builtin_dispatch_base_id && !msl_options.supports_msl_version(1, 2))
		add_active_interface_variable(builtin_dispatch_base_id);
	if (builtin_sample_mask_id)
		add_active_interface_variable(builtin_sample_mask_id);
	if (builtin_frag_depth_id)
		add_active_interface_variable(builtin_frag_depth_id);

	// Create structs to hold input, output and uniform variables.
	// Do output first to ensure out. is declared at top of entry function.
	qual_pos_var_name = "";
	if (is_mesh_shader())
	{
		fixup_implicit_builtin_block_names(get_execution_model());
	}
	else
	{
		stage_out_var_id = add_interface_block(StorageClassOutput);
		patch_stage_out_var_id = add_interface_block(StorageClassOutput, true);
		stage_in_var_id = add_interface_block(StorageClassInput);
	}

	if (is_tese_shader())
		patch_stage_in_var_id = add_interface_block(StorageClassInput, true);

	if (is_tesc_shader())
		stage_out_ptr_var_id = add_interface_block_pointer(stage_out_var_id, StorageClassOutput);
	if (is_tessellation_shader())
		stage_in_ptr_var_id = add_interface_block_pointer(stage_in_var_id, StorageClassInput);

	if (is_mesh_shader())
	{
		mesh_out_per_vertex = add_meshlet_block(false);
		mesh_out_per_primitive = add_meshlet_block(true);
	}

	// Metal vertex functions that define no output must disable rasterization and return void.
	if (!stage_out_var_id)
		is_rasterization_disabled = true;

	// Convert the use of global variables to recursively-passed function parameters
	localize_global_variables();
	extract_global_variables_from_functions();

	// Mark any non-stage-in structs to be tightly packed.
	mark_packable_structs();
	reorder_type_alias();

	// Add fixup hooks required by shader inputs and outputs. This needs to happen before
	// the loop, so the hooks aren't added multiple times.
	fix_up_shader_inputs_outputs();

	// If we are using argument buffers, we create argument buffer structures for them here.
	// These buffers will be used in the entry point, not the individual resources.
	if (msl_options.argument_buffers)
	{
		if (!msl_options.supports_msl_version(2, 0))
			SPIRV_CROSS_THROW("Argument buffers can only be used with MSL 2.0 and up.");
		analyze_argument_buffers();
	}

	uint32_t pass_count = 0;
	do
	{
		reset(pass_count);

		// Start bindings at zero.
		next_metal_resource_index_buffer = 0;
		next_metal_resource_index_texture = 0;
		next_metal_resource_index_sampler = 0;
		for (auto &id : next_metal_resource_ids)
			id = 0;

		// Move constructor for this type is broken on GCC 4.9 ...
		buffer.reset();

		emit_header();
		emit_custom_templates();
		emit_custom_functions();
		emit_specialization_constants_and_structs();
		emit_resources();
		emit_function(get<SPIRFunction>(ir.default_entry_point), Bitset());

		pass_count++;
	} while (is_forcing_recompilation());

	return buffer.str();
}